

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.h
# Opt level: O2

void __thiscall Minisat::Queue<unsigned_int>::insert(Queue<unsigned_int> *this,uint elem)

{
  int iVar1;
  uint *puVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  vec<unsigned_int> tmp;
  vec<unsigned_int> local_20;
  
  iVar1 = this->end;
  this->end = iVar1 + 1;
  (this->buf).data[iVar1] = elem;
  iVar1 = (this->buf).sz;
  iVar4 = this->end;
  if (iVar4 == iVar1) {
    this->end = 0;
    iVar4 = 0;
  }
  if (this->first == iVar4) {
    vec<unsigned_int>::vec(&local_20,iVar1 * 3 + 1 >> 1);
    lVar5 = (long)this->first;
    lVar6 = lVar5 * 4;
    puVar2 = (this->buf).data;
    lVar3 = 0;
    for (; lVar5 < (this->buf).sz; lVar5 = lVar5 + 1) {
      *(undefined4 *)((long)local_20.data + lVar3) = *(undefined4 *)((long)puVar2 + lVar3 + lVar6);
      lVar3 = lVar3 + 4;
    }
    puVar2 = (this->buf).data;
    for (lVar6 = 0; lVar6 < this->end; lVar6 = lVar6 + 1) {
      *(uint *)((long)local_20.data + lVar6 * 4 + lVar3) = puVar2[lVar6];
    }
    this->first = 0;
    this->end = (this->buf).sz;
    vec<unsigned_int>::moveTo(&local_20,&this->buf);
    vec<unsigned_int>::~vec(&local_20);
  }
  return;
}

Assistant:

void insert(T elem)
    { // INVARIANT: buf[end] is always unused
        buf[end++] = elem;
        if (end == buf.size()) end = 0;
        if (first == end) { // Resize:
            vec<T> tmp((buf.size() * 3 + 1) >> 1);
            //**/printf("queue alloc: %d elems (%.1f MB)\n", tmp.size(), tmp.size() * sizeof(T) / 1000000.0);
            int i = 0;
            for (int j = first; j < buf.size(); j++) tmp[i++] = buf[j];
            for (int j = 0; j < end; j++) tmp[i++] = buf[j];
            first = 0;
            end = buf.size();
            tmp.moveTo(buf);
        }
    }